

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 Decompress_BitPacking_16
                (UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmpParams)

{
  byte bVar1;
  UINT8 UVar2;
  UINT8 UVar3;
  UINT16 UVar4;
  ushort uVar5;
  undefined1 auVar6 [12];
  FUINT8 FVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  UINT8 *pUVar11;
  short local_82;
  ushort local_7e;
  FUINT8 outBit;
  FUINT8 bitMask;
  FUINT8 inValB;
  FUINT8 bitReadVal;
  FUINT8 bitsToRead;
  UINT16 *ent2B;
  FUINT8 outShift;
  FUINT8 inShift;
  FUINT16 outVal;
  FUINT16 inVal;
  UINT8 *outDataEnd;
  UINT8 *pUStack_50;
  UINT32 outLenMax;
  UINT8 *outPos;
  UINT8 *inPos;
  FUINT16 addVal;
  FUINT8 bitsCmp;
  uint cmpSubType;
  PCM_CMP_INF *cmpParams_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  bVar1 = cmpParams->bitsCmp;
  uVar8 = (ushort)bVar1;
  UVar4 = cmpParams->baseVal;
  _bitMask = (UINT8 *)0x0;
  if (cmpParams->subType == '\x02') {
    _bitMask = (cmpParams->comprTbl->values).d8;
    if (cmpParams->comprTbl->valueCount == 0) {
      return '\x10';
    }
    if ((cmpParams->bitsDec != cmpParams->comprTbl->bitsDec) ||
       (cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)) {
      return '\x11';
    }
  }
  ent2B._6_2_ = 0;
  UVar2 = cmpParams->bitsDec;
  auVar6._4_8_ = 0;
  auVar6._0_4_ = inLen;
  uVar10 = SUB124((auVar6 << 4) / ZEXT112(cmpParams->bitsCmp),0);
  outData_local._0_4_ = outLen;
  if (uVar10 < outLen) {
    outData_local._0_4_ = uVar10;
  }
  pUVar11 = outData + (UINT32)outData_local;
  UVar3 = cmpParams->subType;
  pUStack_50 = outData;
  outPos = inData;
  if (UVar3 == '\0') {
    for (; pUStack_50 < pUVar11; pUStack_50 = pUStack_50 + 2) {
      local_82 = 0;
      _outShift = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar7 = outBit;
        if (7 < outBit) {
          FVar7 = 8;
        }
        outBit = outBit - FVar7;
        uVar9 = (short)(1 << ((byte)FVar7 & 0x1f)) - 1;
        ent2B._6_2_ = ent2B._6_2_ + FVar7;
        uVar5 = (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8);
        local_7e = uVar5 & uVar9;
        if (7 < ent2B._6_2_) {
          ent2B._6_2_ = ent2B._6_2_ - 8;
          outPos = outPos + 1;
          if (ent2B._6_2_ != 0) {
            local_7e = uVar9 & (uVar5 | (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8)
                               );
          }
        }
        _outShift = (uint)local_7e << ((byte)local_82 & 0x1f) | _outShift;
        local_82 = local_82 + FVar7;
      }
      WriteLE16(pUStack_50,(short)_outShift + UVar4);
    }
  }
  else if (UVar3 == '\x01') {
    for (; pUStack_50 < pUVar11; pUStack_50 = pUStack_50 + 2) {
      local_82 = 0;
      _outShift = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar7 = outBit;
        if (7 < outBit) {
          FVar7 = 8;
        }
        outBit = outBit - FVar7;
        uVar9 = (short)(1 << ((byte)FVar7 & 0x1f)) - 1;
        ent2B._6_2_ = ent2B._6_2_ + FVar7;
        uVar5 = (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8);
        local_7e = uVar5 & uVar9;
        if (7 < ent2B._6_2_) {
          ent2B._6_2_ = ent2B._6_2_ - 8;
          outPos = outPos + 1;
          if (ent2B._6_2_ != 0) {
            local_7e = uVar9 & (uVar5 | (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8)
                               );
          }
        }
        _outShift = (uint)local_7e << ((byte)local_82 & 0x1f) | _outShift;
        local_82 = local_82 + FVar7;
      }
      WriteLE16(pUStack_50,(short)(_outShift << (UVar2 - bVar1 & 0x1f)) + UVar4);
    }
  }
  else if (UVar3 == '\x02') {
    for (; pUStack_50 < pUVar11; pUStack_50 = pUStack_50 + 2) {
      local_82 = 0;
      _outShift = 0;
      outBit = uVar8;
      while (outBit != 0) {
        FVar7 = outBit;
        if (7 < outBit) {
          FVar7 = 8;
        }
        outBit = outBit - FVar7;
        uVar9 = (short)(1 << ((byte)FVar7 & 0x1f)) - 1;
        ent2B._6_2_ = ent2B._6_2_ + FVar7;
        uVar5 = (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8);
        local_7e = uVar5 & uVar9;
        if (7 < ent2B._6_2_) {
          ent2B._6_2_ = ent2B._6_2_ - 8;
          outPos = outPos + 1;
          if (ent2B._6_2_ != 0) {
            local_7e = uVar9 & (uVar5 | (ushort)(((uint)*outPos << ((byte)ent2B._6_2_ & 0x1f)) >> 8)
                               );
          }
        }
        _outShift = (uint)local_7e << ((byte)local_82 & 0x1f) | _outShift;
        local_82 = local_82 + FVar7;
      }
      WriteLE16(pUStack_50,*(UINT16 *)(_bitMask + (ulong)_outShift * 2));
    }
  }
  return '\0';
}

Assistant:

static UINT8 Decompress_BitPacking_16(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmpParams)
{
	unsigned int cmpSubType;
	FUINT8 bitsCmp;
	FUINT16 addVal;
	const UINT8* inPos;
	UINT8* outPos;
	UINT32 outLenMax;
	const UINT8* outDataEnd;
	FUINT16 inVal;
	FUINT16 outVal;
	FUINT8 inShift;
	FUINT8 outShift;
	const UINT16* ent2B;
	
	// ReadBits Variables
	FUINT8 bitsToRead;
	FUINT8 bitReadVal;
	FUINT8 inValB;
	FUINT8 bitMask;
	FUINT8 outBit;
	
	// --- Bit Packing compression --- (16 bit output)
	cmpSubType = cmpParams->subType;
	bitsCmp = cmpParams->bitsCmp;
	addVal = cmpParams->baseVal;
	ent2B = NULL;
	if (cmpParams->subType == 0x02)
	{
		ent2B = cmpParams->comprTbl->values.d16;
		if (! cmpParams->comprTbl->valueCount)
		{
			return 0x10;	// Error: no table loaded
		}
		else if (cmpParams->bitsDec != cmpParams->comprTbl->bitsDec ||
			cmpParams->bitsCmp != cmpParams->comprTbl->bitsCmp)
		{
			return 0x11;	// Data block and loaded value table incompatible
		}
	}
	
	inShift = 0;
	outShift = cmpParams->bitsDec - bitsCmp;
	outLenMax = MUL_DIV(inLen, 16, cmpParams->bitsCmp);
	if (outLen > outLenMax)
		outLen = outLenMax;
	outDataEnd = outData + outLen;
	
	switch(cmpParams->subType)
	{
	case 0x00:	// Copy
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x02)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			outVal = inVal + addVal;
			// save explicitly in Little Endian
			WriteLE16(outPos, (UINT16)outVal);
		}
		break;
	case 0x01:	// Shift Left
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x02)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			outVal = (inVal << outShift) + addVal;
			// save explicitly in Little Endian
			WriteLE16(outPos, (UINT16)outVal);
		}
		break;
	case 0x02:	// Table
		for (inPos = inData, outPos = outData; outPos < outDataEnd; outPos += 0x02)
		{
			READ_BITS(inPos, inVal, inShift, bitsCmp);
			
			outVal = ent2B[inVal];
			// save explicitly in Little Endian
			WriteLE16(outPos, (UINT16)outVal);
		}
		break;
	}
	
	return 0x00;
}